

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zetMetricGet
          (zet_metric_group_handle_t hMetricGroup,uint32_t *pCount,zet_metric_handle_t *phMetrics)

{
  ze_result_t zVar1;
  ulong uVar2;
  
  if (DAT_0010e800 != (code *)0x0) {
    zVar1 = (*DAT_0010e800)();
    return zVar1;
  }
  if ((phMetrics != (zet_metric_handle_t *)0x0) && (*pCount != 0)) {
    uVar2 = 0;
    do {
      context_t::get()::count = context_t::get()::count + 1;
      phMetrics[uVar2] = context_t::get()::count;
      uVar2 = uVar2 + 1;
    } while (uVar2 < *pCount);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGet(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        uint32_t* pCount,                               ///< [in,out] pointer to the number of metrics.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of metrics available.
                                                        ///< if count is greater than the number of metrics available, then the
                                                        ///< driver shall update the value with the correct number of metrics available.
        zet_metric_handle_t* phMetrics                  ///< [in,out][optional][range(0, *pCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metrics.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGet = context.zetDdiTable.Metric.pfnGet;
        if( nullptr != pfnGet )
        {
            result = pfnGet( hMetricGroup, pCount, phMetrics );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phMetrics ) && ( i < *pCount ); ++i )
                phMetrics[ i ] = reinterpret_cast<zet_metric_handle_t>( context.get() );

        }

        return result;
    }